

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O1

bool duckdb::InsertPadding(idx_t len,string_t *pad,vector<char,_true> *result)

{
  utf8proc_ssize_t uVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  utf8proc_int32_t codepoint;
  utf8proc_int32_t local_34;
  
  uVar4 = (ulong)(pad->value).pointer.length;
  if (uVar4 < 0xd) {
    pcVar3 = (pad->value).pointer.prefix;
  }
  else {
    pcVar3 = (pad->value).pointer.ptr;
  }
  bVar5 = len == 0;
  if (bVar5 || uVar4 != 0) {
    if (len == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      do {
        if (uVar4 <= uVar2) {
          ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                    ((vector<char,std::allocator<char>> *)result,
                     (result->super_vector<char,_std::allocator<char>_>).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish,pcVar3,pcVar3 + uVar4);
          uVar2 = 0;
        }
        uVar1 = utf8proc_iterate((utf8proc_uint8_t *)(pcVar3 + uVar2),uVar4 - uVar2,&local_34);
        uVar2 = uVar1 + uVar2;
        len = len - 1;
      } while (len != 0);
    }
    ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              ((vector<char,std::allocator<char>> *)result,
               (result->super_vector<char,_std::allocator<char>_>).
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish,pcVar3,pcVar3 + uVar2);
  }
  return bVar5 || uVar4 != 0;
}

Assistant:

static bool InsertPadding(const idx_t len, const string_t &pad, vector<char> &result) {
	//  Copy the padding until the output is long enough
	auto data = pad.GetData();
	auto size = pad.GetSize();

	//  Check whether we need data that we don't have
	if (len > 0 && size == 0) {
		return false;
	}

	//  Insert characters until we have all we need.
	auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);
	idx_t nbytes = 0;
	for (idx_t nchars = 0; nchars < len; ++nchars) {
		//  If we are at the end of the pad, flush all of it and loop back
		if (nbytes >= size) {
			result.insert(result.end(), data, data + size);
			nbytes = 0;
		}

		//  Write the next character
		utf8proc_int32_t codepoint;
		auto bytes = utf8proc_iterate(str + nbytes, UnsafeNumericCast<utf8proc_ssize_t>(size - nbytes), &codepoint);
		D_ASSERT(bytes > 0);
		nbytes += UnsafeNumericCast<idx_t>(bytes);
	}

	//  Flush the remaining pad
	result.insert(result.end(), data, data + nbytes);

	return true;
}